

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL> __thiscall
slang::parsing::Parser::parseClassSpecifierList(Parser *this,bool allowSpecifiers)

{
  SourceRange range;
  SourceRange range_00;
  SourceRange range_01;
  SourceRange range_02;
  string_view arg;
  string_view arg_00;
  span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL> sVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  size_t extraout_RDX;
  byte in_SIL;
  undefined8 *in_RDI;
  SourceRange SVar4;
  SourceRange SVar5;
  string_view sVar6;
  SourceRange SVar7;
  Token ok;
  Token sk;
  ClassSpecifierSyntax *other;
  iterator __end4;
  iterator __begin4;
  SmallVector<slang::syntax::ClassSpecifierSyntax_*,_5UL> *__range4;
  ClassSpecifierSyntax *specifier;
  SmallVector<slang::syntax::ClassSpecifierSyntax_*,_5UL> specifiers;
  bool erroredOnFinal;
  ClassSpecifierSyntax **in_stack_fffffffffffffda8;
  Diagnostic *in_stack_fffffffffffffdb0;
  undefined6 in_stack_fffffffffffffdb8;
  TokenKind in_stack_fffffffffffffdbe;
  SourceLocation in_stack_fffffffffffffdc0;
  ParserBase *in_stack_fffffffffffffdc8;
  SourceLocation in_stack_fffffffffffffdd0;
  SourceLocation this_00;
  SourceLocation in_stack_fffffffffffffdd8;
  Diagnostic *in_stack_fffffffffffffde0;
  DiagCode code;
  Diagnostic *in_stack_fffffffffffffdf0;
  Diagnostic *in_stack_fffffffffffffdf8;
  SourceLocation in_stack_fffffffffffffe00;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  Token local_d0;
  undefined8 local_c0;
  Info *local_b8;
  ClassSpecifierSyntax *local_b0;
  iterator local_a8;
  iterator local_a0;
  SmallVectorBase<slang::syntax::ClassSpecifierSyntax_*> *local_98;
  SourceRange local_90;
  undefined4 local_7c;
  ClassSpecifierSyntax *local_78;
  SmallVectorBase<slang::syntax::ClassSpecifierSyntax_*> local_60 [2];
  byte local_1a;
  byte local_19;
  pointer local_10;
  __extent_storage<18446744073709551615UL> local_8;
  
  local_19 = in_SIL & 1;
  local_1a = 0;
  SmallVector<slang::syntax::ClassSpecifierSyntax_*,_5UL>::SmallVector
            ((SmallVector<slang::syntax::ClassSpecifierSyntax_*,_5UL> *)0x6cb1a0);
  SVar7.endLoc = in_stack_fffffffffffffdd0;
  SVar7.startLoc = in_stack_fffffffffffffdd8;
  do {
    bVar2 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbe);
    if (!bVar2) {
      iVar3 = SmallVectorBase<slang::syntax::ClassSpecifierSyntax_*>::copy
                        (local_60,(EVP_PKEY_CTX *)*in_RDI,src);
      local_10 = (pointer)CONCAT44(extraout_var,iVar3);
      local_8._M_extent_value = extraout_RDX;
      SmallVector<slang::syntax::ClassSpecifierSyntax_*,_5UL>::~SmallVector
                ((SmallVector<slang::syntax::ClassSpecifierSyntax_*,_5UL> *)0x6cb783);
      sVar1._M_extent._M_extent_value = local_8._M_extent_value;
      sVar1._M_ptr = local_10;
      return sVar1;
    }
    local_78 = parseClassSpecifier((Parser *)
                                   CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
    in_stack_fffffffffffffe7f = Token::isMissing(&local_78->keyword);
    if (!(bool)in_stack_fffffffffffffe7f) {
      bVar2 = SmallVectorBase<slang::syntax::ClassSpecifierSyntax_*>::empty(local_60);
      if ((bVar2) && ((local_19 & 1) == 0)) {
        local_7c = 0xa30005;
        SVar4 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffe00);
        SVar5.endLoc = SVar7.startLoc;
        SVar5.startLoc = SVar7.endLoc;
        local_90 = SVar4;
        ParserBase::addDiag(in_stack_fffffffffffffdc8,
                            SUB84((ulong)in_stack_fffffffffffffde0 >> 0x20,0),SVar5);
      }
      local_98 = local_60;
      local_a0 = SmallVectorBase<slang::syntax::ClassSpecifierSyntax_*>::begin(local_98);
      local_a8 = SmallVectorBase<slang::syntax::ClassSpecifierSyntax_*>::end(local_98);
      for (; local_a0 != local_a8; local_a0 = local_a0 + 1) {
        local_b0 = *local_a0;
        local_c0._0_2_ = (local_78->keyword).kind;
        local_c0._2_1_ = (local_78->keyword).field_0x2;
        local_c0._3_1_ = (local_78->keyword).numFlags;
        local_c0._4_4_ = (local_78->keyword).rawLen;
        local_b8 = (local_78->keyword).info;
        local_d0.kind = (local_b0->keyword).kind;
        local_d0._2_1_ = (local_b0->keyword).field_0x2;
        local_d0.numFlags.raw = (local_b0->keyword).numFlags.raw;
        local_d0.rawLen = (local_b0->keyword).rawLen;
        local_d0.info = (local_b0->keyword).info;
        if ((short)local_c0 == local_d0.kind) {
          Token::range((Token *)SVar7.endLoc);
          range_00.endLoc = SVar7.startLoc;
          range_00.startLoc = SVar7.endLoc;
          ParserBase::addDiag(in_stack_fffffffffffffdc8,
                              SUB84((ulong)in_stack_fffffffffffffde0 >> 0x20,0),range_00);
          Token::valueText((Token *)in_stack_fffffffffffffdc0);
          sVar6._M_str = (char *)in_stack_fffffffffffffe00;
          sVar6._M_len = (size_t)in_stack_fffffffffffffdf8;
          Diagnostic::operator<<(in_stack_fffffffffffffdf0,sVar6);
          Token::range((Token *)SVar7.endLoc);
          SVar4.startLoc._6_2_ = in_stack_fffffffffffffdbe;
          SVar4.startLoc._0_6_ = in_stack_fffffffffffffdb8;
          SVar4.endLoc = in_stack_fffffffffffffdc0;
          Diagnostic::operator<<(in_stack_fffffffffffffdb0,SVar4);
          break;
        }
        if ((local_d0.kind == FinalKeyword) && ((local_1a & 1) == 0)) {
          local_1a = 1;
          Token::range((Token *)SVar7.endLoc);
          range_01.endLoc = SVar7.startLoc;
          range_01.startLoc = SVar7.endLoc;
          ParserBase::addDiag(in_stack_fffffffffffffdc8,
                              SUB84((ulong)in_stack_fffffffffffffde0 >> 0x20,0),range_01);
          break;
        }
        bVar2 = Token::isMissing(&local_d0);
        code = SUB84((ulong)in_stack_fffffffffffffde0 >> 0x20,0);
        if (((!bVar2) && (local_d0.kind != FinalKeyword)) && ((short)local_c0 != 0xa8)) {
          SVar5 = Token::range((Token *)SVar7.endLoc);
          in_stack_fffffffffffffe00 = SVar5.endLoc;
          range_02.endLoc = SVar7.startLoc;
          range_02.startLoc = SVar7.endLoc;
          in_stack_fffffffffffffdf8 = ParserBase::addDiag(in_stack_fffffffffffffdc8,code,range_02);
          this_00 = SVar7.endLoc;
          sVar6 = Token::valueText((Token *)in_stack_fffffffffffffdc0);
          in_stack_fffffffffffffdf0 = (Diagnostic *)sVar6._M_len;
          arg._M_str = (char *)in_stack_fffffffffffffe00;
          arg._M_len = (size_t)in_stack_fffffffffffffdf8;
          in_stack_fffffffffffffde0 = Diagnostic::operator<<(in_stack_fffffffffffffdf0,arg);
          SVar7 = Token::range((Token *)this_00);
          range.startLoc._6_2_ = in_stack_fffffffffffffdbe;
          range.startLoc._0_6_ = in_stack_fffffffffffffdb8;
          range.endLoc = in_stack_fffffffffffffdc0;
          in_stack_fffffffffffffdc8 =
               (ParserBase *)Diagnostic::operator<<(in_stack_fffffffffffffdb0,range);
          sVar6 = Token::valueText((Token *)in_stack_fffffffffffffdc0);
          in_stack_fffffffffffffdc0 = (SourceLocation)sVar6._M_len;
          in_stack_fffffffffffffdb8 = sVar6._M_str._0_6_;
          in_stack_fffffffffffffdbe = sVar6._M_str._6_2_;
          arg_00._M_str = (char *)in_stack_fffffffffffffe00;
          arg_00._M_len = (size_t)in_stack_fffffffffffffdf8;
          Diagnostic::operator<<(in_stack_fffffffffffffdf0,arg_00);
          break;
        }
      }
    }
    SmallVectorBase<slang::syntax::ClassSpecifierSyntax_*>::push_back
              ((SmallVectorBase<slang::syntax::ClassSpecifierSyntax_*> *)in_stack_fffffffffffffdb0,
               in_stack_fffffffffffffda8);
  } while( true );
}

Assistant:

std::span<syntax::ClassSpecifierSyntax*> Parser::parseClassSpecifierList(bool allowSpecifiers) {
    bool erroredOnFinal = false;
    SmallVector<ClassSpecifierSyntax*> specifiers;
    while (peek(TokenKind::Colon)) {
        auto specifier = parseClassSpecifier();
        SLANG_ASSERT(specifier);

        if (!specifier->keyword.isMissing()) {
            if (specifiers.empty() && !allowSpecifiers)
                addDiag(diag::SpecifiersNotAllowed, specifier->sourceRange());

            for (auto other : specifiers) {
                const auto sk = specifier->keyword;
                const auto ok = other->keyword;

                if (sk.kind == ok.kind) {
                    addDiag(diag::DuplicateClassSpecifier, sk.range())
                        << sk.valueText() << ok.range();
                    break;
                }

                if (ok.kind == TokenKind::FinalKeyword && !erroredOnFinal) {
                    erroredOnFinal = true;
                    addDiag(diag::FinalSpecifierLast, ok.range());
                    break;
                }

                if (!ok.isMissing() && ok.kind != TokenKind::FinalKeyword &&
                    sk.kind != TokenKind::FinalKeyword) {
                    addDiag(diag::ClassSpecifierConflict, sk.range())
                        << sk.valueText() << ok.range() << ok.valueText();
                    break;
                }
            }
        }

        specifiers.push_back(specifier);
    }

    return specifiers.copy(alloc);
}